

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid_Image.cxx
# Opt level: O1

void __thiscall Fluid_Image::~Fluid_Image(Fluid_Image *this)

{
  Fluid_Image **ppFVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  ppFVar1 = images;
  if (images != (Fluid_Image **)0x0) {
    lVar3 = 0;
    do {
      lVar2 = lVar3;
      lVar3 = lVar2 + 1;
    } while (images[lVar2] != this);
    numimages = numimages - 1;
    if ((int)lVar2 < numimages) {
      uVar4 = (ulong)(uint)numimages;
      do {
        ppFVar1[lVar3 + -1] = ppFVar1[lVar3];
        lVar3 = lVar3 + 1;
      } while (uVar4 + 1 != lVar3);
    }
  }
  if (this->img != (Fl_Shared_Image *)0x0) {
    Fl_Shared_Image::release(this->img);
  }
  free(this->name_);
  return;
}

Assistant:

Fluid_Image::~Fluid_Image() {
  int a;
  if (images) {
    for (a = 0;; a++) if (images[a] == this) break;
    numimages--;
    for (; a < numimages; a++) images[a] = images[a+1];
  }
  if (img) img->release();
  free((void*)name_);
}